

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall doctest::detail::TestCase::TestCase(TestCase *this,TestCase *other)

{
  TestCase *in_RDI;
  TestCase *in_stack_ffffffffffffffc8;
  
  *(undefined8 *)&(in_RDI->super_TestCaseData).m_expected_failures = 0;
  (in_RDI->super_TestCaseData).m_timeout = 0.0;
  (in_RDI->super_TestCaseData).m_description = (char *)0x0;
  (in_RDI->super_TestCaseData).m_skip = false;
  (in_RDI->super_TestCaseData).m_no_breaks = false;
  (in_RDI->super_TestCaseData).m_no_output = false;
  (in_RDI->super_TestCaseData).m_may_fail = false;
  (in_RDI->super_TestCaseData).m_should_fail = false;
  *(undefined3 *)&(in_RDI->super_TestCaseData).field_0x3d = 0;
  (in_RDI->super_TestCaseData).m_name = (char *)0x0;
  (in_RDI->super_TestCaseData).m_test_suite = (char *)0x0;
  *(undefined8 *)((long)&(in_RDI->super_TestCaseData).m_file.field_0 + 0x10) = 0;
  *(undefined8 *)&(in_RDI->super_TestCaseData).m_line = 0;
  (in_RDI->super_TestCaseData).m_file.field_0.data.ptr = (char *)0x0;
  *(undefined8 *)((long)&(in_RDI->super_TestCaseData).m_file.field_0 + 8) = 0;
  TestCaseData::TestCaseData((TestCaseData *)0x10a693);
  String::String((String *)0x10a6a6);
  operator=(in_RDI,in_stack_ffffffffffffffc8);
  return;
}

Assistant:

TestCase::TestCase(const TestCase& other)
            : TestCaseData() {
        *this = other;
    }